

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

WildcardMatcher * begin_wildcard_matching(char *name)

{
  int iVar1;
  WildcardMatcher *ret;
  char *name_local;
  
  name_local = (char *)safemalloc(1,0x50,0);
  iVar1 = glob(name,0,(__errfunc *)0x0,(glob_t *)name_local);
  if (iVar1 < 0) {
    safefree(name_local);
    name_local = (char *)0x0;
  }
  else {
    *(undefined4 *)&((glob_t *)((long)name_local + 0x48))->gl_pathc = 0;
  }
  return (WildcardMatcher *)name_local;
}

Assistant:

WildcardMatcher *begin_wildcard_matching(const char *name) {
    WildcardMatcher *ret = snew(WildcardMatcher);

    if (glob(name, 0, NULL, &ret->globbed) < 0) {
        sfree(ret);
        return NULL;
    }

    ret->i = 0;

    return ret;
}